

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunctionRotation_SQUAD.cpp
# Opt level: O3

ChQuaternion<double> *
chrono::QUADRANGLE(ChQuaternion<double> *__return_storage_ptr__,ChQuaternion<double> *q0,
                  ChQuaternion<double> *q1,ChQuaternion<double> *q2)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [64];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  double dVar51;
  double local_88;
  ulong local_20;
  undefined1 extraout_var [56];
  
  dVar8 = q1->m_data[1];
  auVar38._8_8_ = 0;
  auVar38._0_8_ = dVar8;
  dVar51 = q1->m_data[2];
  auVar40._8_8_ = 0;
  auVar40._0_8_ = dVar51;
  dVar9 = q1->m_data[3];
  auVar42._8_8_ = 0;
  auVar42._0_8_ = dVar9;
  dVar1 = q1->m_data[0];
  auVar35._8_8_ = 0;
  auVar35._0_8_ = dVar1;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = q2->m_data[2];
  auVar25._8_8_ = 0;
  auVar25._0_8_ = q2->m_data[1];
  auVar16._8_8_ = 0;
  auVar16._0_8_ = q2->m_data[3];
  auVar33 = ZEXT816(0x4000000000000000);
  auVar44._0_8_ = -dVar8;
  auVar44._8_8_ = 0x8000000000000000;
  auVar48._0_8_ = -dVar51;
  auVar48._8_8_ = 0x8000000000000000;
  auVar46._0_8_ = -dVar9;
  auVar46._8_8_ = 0x8000000000000000;
  dVar7 = q2->m_data[0];
  auVar11._8_8_ = 0;
  auVar11._0_8_ = dVar7;
  auVar2 = vmulsd_avx512f(auVar11,auVar38);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = dVar51 * dVar7;
  auVar5 = vfmsub231sd_fma(auVar3,auVar35,auVar21);
  auVar3 = vfmsub231sd_avx512f(auVar2,auVar35,auVar25);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = dVar9 * dVar7;
  auVar2 = vfmsub231sd_fma(auVar2,auVar35,auVar16);
  auVar4 = vfnmadd231sd_fma(auVar5,auVar42,auVar25);
  auVar3 = vfmadd231sd_avx512f(auVar3,auVar42,auVar21);
  auVar5 = vfmadd231sd_fma(auVar2,auVar40,auVar25);
  auVar2 = vfmadd231sd_fma(auVar4,auVar38,auVar16);
  dVar51 = auVar2._0_8_;
  auVar4 = vfnmadd231sd_avx512f(auVar3,auVar40,auVar16);
  auVar2 = vfnmadd231sd_fma(auVar5,auVar38,auVar21);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = dVar51 * dVar51;
  auVar5 = vfmadd231sd_avx512f(auVar5,auVar4,auVar4);
  auVar5 = vfmadd231sd_fma(auVar5,auVar2,auVar2);
  if (1e-30 < auVar5._0_8_) {
    vmovsd_avx512f(auVar4);
    auVar26._8_8_ = 0;
    auVar26._0_8_ = dVar8 * q2->m_data[1];
    auVar4 = vfmadd213sd_fma(auVar11,auVar35,auVar26);
    auVar4 = vfmadd213sd_fma(auVar21,auVar40,auVar4);
    auVar5 = vsqrtsd_avx(auVar5,auVar5);
    auVar4 = vfmadd213sd_fma(auVar16,auVar42,auVar4);
    dVar7 = atan2(auVar5._0_8_,auVar4._0_8_);
    auVar33._0_8_ = (dVar7 + dVar7) / auVar5._0_8_;
    auVar33._8_8_ = 0;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = local_20;
    local_88 = dVar9;
  }
  auVar36._8_8_ = 0;
  auVar36._0_8_ = dVar1;
  auVar50 = ZEXT816(0x4000000000000000);
  dVar9 = q0->m_data[0];
  auVar12._8_8_ = 0;
  auVar12._0_8_ = dVar9;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = q0->m_data[1];
  auVar22._8_8_ = 0;
  auVar22._0_8_ = q0->m_data[2];
  auVar3 = vmulsd_avx512f(auVar4,auVar33);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = q0->m_data[3];
  auVar5 = vmulsd_avx512f(auVar12,auVar44);
  auVar5 = vfmadd231sd_avx512f(auVar5,auVar36,auVar27);
  auVar5 = vfmadd231sd_avx512f(auVar5,auVar42,auVar22);
  auVar6 = vfmadd231sd_avx512f(auVar5,auVar48,auVar17);
  auVar49._8_8_ = 0;
  auVar49._0_8_ = auVar48._0_8_ * dVar9;
  auVar5 = vfmadd231sd_fma(auVar49,auVar36,auVar22);
  auVar5 = vfmadd231sd_fma(auVar5,auVar46,auVar27);
  auVar47._8_8_ = 0;
  auVar47._0_8_ = auVar46._0_8_ * dVar9;
  auVar4 = vfmadd231sd_fma(auVar47,auVar36,auVar17);
  auVar5 = vfmadd231sd_fma(auVar5,auVar38,auVar17);
  dVar9 = auVar5._0_8_;
  auVar5 = vfmadd231sd_fma(auVar4,auVar40,auVar27);
  auVar5 = vfmadd231sd_fma(auVar5,auVar22,auVar44);
  auVar30._8_8_ = 0;
  auVar30._0_8_ = dVar9 * dVar9;
  auVar4 = vfmadd231sd_avx512f(auVar30,auVar6,auVar6);
  auVar4 = vfmadd231sd_fma(auVar4,auVar5,auVar5);
  if (1e-30 < auVar4._0_8_) {
    vmovsd_avx512f(auVar6);
    auVar28._8_8_ = 0;
    auVar28._0_8_ = dVar8 * q0->m_data[1];
    auVar11 = vfmadd213sd_fma(auVar12,auVar36,auVar28);
    auVar11 = vfmadd213sd_fma(auVar22,auVar40,auVar11);
    auVar4 = vsqrtsd_avx(auVar4,auVar4);
    auVar11 = vfmadd213sd_fma(auVar17,auVar42,auVar11);
    dVar8 = atan2(auVar4._0_8_,auVar11._0_8_);
    auVar50._0_8_ = (dVar8 + dVar8) / auVar4._0_8_;
    auVar50._8_8_ = 0;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = local_88;
  }
  auVar4 = vmulsd_avx512f(auVar6,auVar50);
  dVar1 = (auVar3._0_8_ + auVar4._0_8_) * -0.25;
  dVar8 = (dVar51 * auVar33._0_8_ + dVar9 * auVar50._0_8_) * -0.25;
  dVar51 = (auVar2._0_8_ * auVar33._0_8_ + auVar5._0_8_ * auVar50._0_8_) * -0.25;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = dVar8 * dVar8;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = dVar1;
  auVar5 = vfmadd231sd_fma(auVar13,auVar31,auVar31);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = dVar51;
  auVar5 = vfmadd231sd_fma(auVar5,auVar18,auVar18);
  if (auVar5._0_8_ <= 1e-30) {
    dVar9 = 0.5;
    auVar5 = ZEXT816(0x3ff0000000000000);
  }
  else {
    auVar5 = vsqrtsd_avx(auVar5,auVar5);
    dVar7 = auVar5._0_8_ * 0.5;
    dVar9 = sin(dVar7);
    dVar9 = dVar9 / auVar5._0_8_;
    auVar15._0_8_ = cos(dVar7);
    auVar15._8_56_ = extraout_var;
    auVar5 = auVar15._0_16_;
  }
  dVar7 = q1->m_data[1];
  auVar34._8_8_ = 0;
  auVar34._0_8_ = dVar7;
  auVar39._8_8_ = 0;
  auVar39._0_8_ = q1->m_data[2];
  dVar51 = dVar51 * dVar9;
  dVar1 = dVar1 * dVar9;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = q1->m_data[0];
  auVar41._8_8_ = 0;
  auVar41._0_8_ = q1->m_data[3];
  dVar10 = auVar5._0_8_;
  auVar37._8_8_ = 0;
  auVar37._0_8_ = dVar1 * dVar7;
  auVar3 = vfmsub231sd_fma(auVar37,auVar32,auVar5);
  auVar29._8_8_ = 0;
  auVar29._0_8_ = dVar1;
  auVar43._8_8_ = 0;
  auVar43._0_8_ = dVar10 * dVar7;
  auVar5 = vfmadd231sd_fma(auVar43,auVar32,auVar29);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = dVar8 * dVar9;
  auVar45._8_8_ = 0;
  auVar45._0_8_ = dVar10 * q1->m_data[2];
  auVar2 = vfmadd231sd_fma(auVar45,auVar32,auVar23);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = q1->m_data[3] * dVar10;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = dVar51;
  auVar4 = vfmadd231sd_fma(auVar14,auVar32,auVar19);
  auVar3 = vfnmadd231sd_fma(auVar3,auVar39,auVar23);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = dVar8 * dVar9;
  auVar11 = vfnmadd231sd_fma(auVar5,auVar41,auVar24);
  auVar5 = vfmadd231sd_fma(auVar2,auVar41,auVar29);
  auVar4 = vfnmadd231sd_fma(auVar4,auVar39,auVar29);
  auVar3 = vfnmadd231sd_fma(auVar3,auVar41,auVar19);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = dVar51;
  auVar2 = vfmadd231sd_fma(auVar11,auVar39,auVar20);
  auVar11 = vfnmadd231sd_fma(auVar5,auVar34,auVar20);
  auVar5 = vfmadd231sd_fma(auVar4,auVar34,auVar24);
  __return_storage_ptr__->m_data[0] = auVar3._0_8_;
  __return_storage_ptr__->m_data[1] = auVar2._0_8_;
  __return_storage_ptr__->m_data[2] = auVar11._0_8_;
  __return_storage_ptr__->m_data[3] = auVar5._0_8_;
  return __return_storage_ptr__;
}

Assistant:

ChQuaternion<> QUADRANGLE(const ChQuaternion<>& q0, const ChQuaternion<>& q1, const ChQuaternion<>& q2) {
       
	ChQuaternion<> qInv = q1.GetConjugate();

	ChQuaternion<> sq1 = qInv * q2;
        
	ChVector<> cart0 = sq1.Q_to_Rotv(); 
 
	ChQuaternion<> sq0 = qInv * q0;

	ChVector<> cart1 = sq0.Q_to_Rotv();

	ChVector<> cart_aux = (cart0 + cart1) * -0.25;

	ChQuaternion<> q_aux; q_aux.Q_from_Rotv(cart_aux);

	return q1 * q_aux; 
 }